

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O0

bool __thiscall
sptk::CepstrumToAutocorrelation::Run
          (CepstrumToAutocorrelation *this,vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  anon_class_8_1_54a3981a in_RDI;
  double z;
  int fft_length;
  int output_length;
  int input_length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff48;
  
  iVar2 = *(int *)&(((Buffer *)in_RDI.z)->real_part_input_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((((((ulong)(((Buffer *)((long)in_RDI.z + 0x70))->real_part_input_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start & 1) == 0) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 != (long)(iVar2 + 1))) || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0))
     || (in_RCX == 0)) {
    return false;
  }
  iVar2 = *(int *)((long)&(((Buffer *)in_RDI.z)->real_part_input_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + 4);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar3 != (long)(iVar2 + 1)) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40._M_current,
               (size_type)in_stack_ffffffffffffff38._M_current);
  }
  iVar2 = RealValuedFastFourierTransform::GetFftLength
                    ((RealValuedFastFourierTransform *)
                     &(((Buffer *)in_RDI.z)->real_part_input_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar3 != (long)iVar2) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40._M_current,
               (size_type)in_stack_ffffffffffffff38._M_current);
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffff28._M_current,(difference_type)in_RDI.z);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(double *)in_RDI.z);
  bVar1 = RealValuedFastFourierTransform::Run
                    ((RealValuedFastFourierTransform *)in_stack_ffffffffffffff38._M_current,
                     (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30._M_current
                     ,(vector<double,_std::allocator<double>_> *)
                      in_stack_ffffffffffffff28._M_current,(Buffer *)in_RDI.z);
  if (!bVar1) {
    return false;
  }
  iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  iVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  iVar6 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::CepstrumToAutocorrelation::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::CepstrumToAutocorrelation::Buffer*)const::__0>
            (iVar4._M_current,iVar5._M_current,iVar6._M_current);
  bVar1 = RealValuedFastFourierTransform::Run
                    ((RealValuedFastFourierTransform *)in_stack_ffffffffffffff38._M_current,
                     (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30._M_current
                     ,(vector<double,_std::allocator<double>_> *)
                      in_stack_ffffffffffffff28._M_current,(Buffer *)in_RDI.z);
  if (!bVar1) {
    return false;
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffff28._M_current,(difference_type)in_RDI.z);
  iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::CepstrumToAutocorrelation::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::CepstrumToAutocorrelation::Buffer*)const::__1>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current,(double *)(1.0 / (double)iVar2),in_stack_ffffffffffffff28,in_RDI);
  return true;
}

Assistant:

bool CepstrumToAutocorrelation::Run(
    const std::vector<double>& cepstrum, std::vector<double>* autocorrelation,
    CepstrumToAutocorrelation::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ || cepstrum.size() != static_cast<std::size_t>(input_length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (autocorrelation->size() != static_cast<std::size_t>(output_length)) {
    autocorrelation->resize(output_length);
  }
  const int fft_length(fast_fourier_transform_.GetFftLength());
  if (buffer->real_part_.size() != static_cast<std::size_t>(fft_length)) {
    buffer->real_part_.resize(fft_length);
  }

  std::copy(cepstrum.begin(), cepstrum.end(), buffer->real_part_.begin());
  std::fill(buffer->real_part_.begin() + input_length, buffer->real_part_.end(),
            0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  std::transform(buffer->real_part_.begin(), buffer->real_part_.end(),
                 buffer->real_part_.begin(),
                 [](double x) { return std::exp(2.0 * x); });

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  const double z(1.0 / fft_length);
  std::transform(buffer->real_part_.begin(),
                 buffer->real_part_.begin() + output_length,
                 autocorrelation->begin(), [z](double x) { return x * z; });

  return true;
}